

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O3

void __thiscall common::Options::Options(Options *this)

{
  (this->cmd)._M_dataplus._M_p = (pointer)&(this->cmd).field_2;
  (this->cmd)._M_string_length = 0;
  (this->cmd).field_2._M_local_buf[0] = '\0';
  (this->group)._M_dataplus._M_p = (pointer)&(this->group).field_2;
  (this->group)._M_string_length = 0;
  (this->group).field_2._M_local_buf[0] = '\0';
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  (this->params)._M_dataplus._M_p = (pointer)&(this->params).field_2;
  (this->params)._M_string_length = 0;
  (this->params).field_2._M_local_buf[0] = '\0';
  this->index = -1;
  this->log_level = -1;
  (this->log_file)._M_dataplus._M_p = (pointer)&(this->log_file).field_2;
  (this->log_file)._M_string_length = 0;
  (this->log_file).field_2._M_local_buf[0] = '\0';
  (this->config_file)._M_dataplus._M_p = (pointer)&(this->config_file).field_2;
  (this->config_file)._M_string_length = 0;
  (this->config_file).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->config_file,0,(char *)0x0,0x12533d);
  return;
}

Assistant:

Options::Options() : index(-1), log_level(-1) {
    config_file = "/etc/xtools.conf";
}